

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,char *c,bool raw)

{
  allocator<char> local_41;
  string local_40;
  byte local_19;
  char *pcStack_18;
  bool raw_local;
  char *c_local;
  FBXExportProperty *this_local;
  
  local_19 = raw;
  pcStack_18 = c;
  c_local = &this->type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,c,&local_41);
  FBXExportProperty(this,&local_40,(bool)(local_19 & 1));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const char* c, bool raw)
: FBXExportProperty(std::string(c), raw) {
    // empty
}